

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

Result<wallet::SelectionResult> *
wallet::coinselector_tests::SelectCoinsSRD
          (Result<wallet::SelectionResult> *__return_storage_ptr__,CAmount *target,
          CoinSelectionParams *cs_params,NodeContext *m_node,int max_selection_weight,
          function<wallet::CoinsResult_(wallet::CWallet_&)> *coin_setup)

{
  mapped_type *pmVar1;
  long in_FS_OFFSET;
  initializer_list<wallet::SelectionFilter> __l;
  allocator_type local_149;
  _Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> local_148;
  Groups group;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  _Head_base<0UL,_ECC_Context_*,_false> local_f8;
  undefined1 uStack_f0;
  undefined7 local_ef;
  undefined1 uStack_e8;
  undefined8 uStack_e7;
  unique_ptr<CConnman,_std::default_delete<CConnman>_> local_d8;
  undefined1 uStack_d0;
  undefined7 uStack_cf;
  undefined1 uStack_c8;
  undefined8 uStack_c7;
  bool local_b8;
  CoinsResult local_b0;
  _Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  local_68;
  _Manager_type local_38;
  
  local_38 = *(_Manager_type *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"",(allocator<char> *)&group);
  NewWallet((NodeContext *)&wallet,(string *)m_node);
  std::__cxx11::string::~string((string *)&local_b0);
  uStack_e8 = 0;
  uStack_e7 = 0;
  local_f8._M_head_impl = (ECC_Context *)0x0;
  uStack_f0 = 0;
  local_ef = 0;
  std::function<wallet::CoinsResult_(wallet::CWallet_&)>::operator()
            (&local_b0,coin_setup,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl);
  uStack_c8 = uStack_e8;
  uStack_c7 = uStack_e7;
  local_d8._M_t.super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t.
  super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
  super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
       (__uniq_ptr_data<CConnman,_std::default_delete<CConnman>,_true,_true>)
       (__uniq_ptr_data<CConnman,_std::default_delete<CConnman>,_true,_true>)local_f8._M_head_impl;
  uStack_d0 = uStack_f0;
  uStack_cf = local_ef;
  local_b8 = true;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_d8;
  std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::vector
            ((vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)&local_148
             ,__l,&local_149);
  GroupOutputs((FilteredOutputGroups *)&local_68,
               (CWallet *)
               wallet._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,&local_b0,cs_params,
               (vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)
               &local_148);
  pmVar1 = std::
           map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
           ::operator[]((map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
                         *)&local_68,(key_type *)&local_f8);
  Groups::Groups(&group,&pmVar1->all_groups);
  std::
  _Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  ::~_Rb_tree(&local_68);
  std::_Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
  ~_Vector_base(&local_148);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&local_b0);
  wallet::SelectCoinsSRD
            (__return_storage_ptr__,&group.positive_group,*target,cs_params->m_change_fee,
             cs_params->rng_fast,max_selection_weight);
  Groups::~Groups(&group);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(&wallet);
  if (*(_Manager_type *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static util::Result<SelectionResult> SelectCoinsSRD(const CAmount& target,
                                                    const CoinSelectionParams& cs_params,
                                                    const node::NodeContext& m_node,
                                                    int max_selection_weight,
                                                    std::function<CoinsResult(CWallet&)> coin_setup)
{
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);
    CoinEligibilityFilter filter(0, 0, 0); // accept all coins without ancestors
    Groups group = GroupOutputs(*wallet, coin_setup(*wallet), cs_params, {{filter}})[filter].all_groups;
    return SelectCoinsSRD(group.positive_group, target, cs_params.m_change_fee, cs_params.rng_fast, max_selection_weight);
}